

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

Op __thiscall diligent_spirv_cross::CompilerGLSL::get_remapped_spirv_op(CompilerGLSL *this,Op op)

{
  uint uVar1;
  
  if ((this->options).relax_nan_checks == true) {
    uVar1 = op - OpFUnordEqual;
    if ((uVar1 < 0xb) && ((0x553U >> (uVar1 & 0x1f) & 1) != 0)) {
      op = *(Op *)(&DAT_007fa140 + (ulong)uVar1 * 4);
    }
  }
  return op;
}

Assistant:

Op CompilerGLSL::get_remapped_spirv_op(Op op) const
{
	if (options.relax_nan_checks)
	{
		switch (op)
		{
		case OpFUnordLessThan:
			op = OpFOrdLessThan;
			break;
		case OpFUnordLessThanEqual:
			op = OpFOrdLessThanEqual;
			break;
		case OpFUnordGreaterThan:
			op = OpFOrdGreaterThan;
			break;
		case OpFUnordGreaterThanEqual:
			op = OpFOrdGreaterThanEqual;
			break;
		case OpFUnordEqual:
			op = OpFOrdEqual;
			break;
		case OpFOrdNotEqual:
			op = OpFUnordNotEqual;
			break;

		default:
			break;
		}
	}

	return op;
}